

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.h
# Opt level: O1

void __thiscall
Parser::MapBindIdentifierFromElement<PostVisitFunction(ParseNodeFnc*,ByteCodeGenerator*)::__1>
          (Parser *this,ParseNodePtr elementNode,anon_class_16_2_de35cfdd handler)

{
  char cVar1;
  byte bVar2;
  Symbol *pSVar3;
  code *pcVar4;
  bool bVar5;
  ParseNodeBin *pPVar6;
  ParseNodeVar *pPVar7;
  undefined4 *puVar8;
  anon_class_16_2_de35cfdd handler_00;
  
  handler_00.i = handler.top;
  cVar1 = *(char *)&(this->m_nodeAllocator).
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                    super_Allocator.outOfMemoryFunc;
  if (cVar1 == '\x11') {
    pPVar6 = (ParseNodeBin *)ParseNode::AsParseNodeUni((ParseNode *)this);
  }
  else {
    if (cVar1 != '1') goto LAB_00839a40;
    pPVar6 = ParseNode::AsParseNodeBin((ParseNode *)this);
  }
  this = (Parser *)pPVar6->pnode1;
LAB_00839a40:
  bVar2 = *(byte *)&(this->m_nodeAllocator).
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                    super_Allocator.outOfMemoryFunc;
  if ((bVar2 & 0xfd) == 0x70) {
    handler_00.top = (FuncInfo **)elementNode;
    MapBindIdentifier<PostVisitFunction(ParseNodeFnc*,ByteCodeGenerator*)::__1>
              ((ParseNodePtr)this,handler_00);
    return;
  }
  if ((byte)(bVar2 + 0xaf) < 3) {
    pPVar7 = ParseNode::AsParseNodeVar((ParseNode *)this);
    pSVar3 = pPVar7->sym;
    if (pSVar3->scopeSlot != -1) {
      *(int *)(*(long *)elementNode + 0xb0) = *(int *)(*(long *)elementNode + 0xb0) + 1;
    }
    pSVar3->scopeSlot = *(uint *)handler_00.i;
    *(uint *)handler_00.i = *(uint *)handler_00.i + 1;
  }
  else if (bVar2 != 0xb) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                       ,0x2dc,"(bindIdentNode->nop == knopEmpty)","Invalid bind identifier");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  return;
}

Assistant:

static void MapBindIdentifierFromElement(ParseNodePtr elementNode, THandler handler)
    {
        ParseNodePtr bindIdentNode = elementNode;
        if (bindIdentNode->nop == knopAsg)
        {
            bindIdentNode = bindIdentNode->AsParseNodeBin()->pnode1;
        }
        else if (bindIdentNode->nop == knopEllipsis)
        {
            bindIdentNode = bindIdentNode->AsParseNodeUni()->pnode1;
        }

        if (bindIdentNode->IsPattern())
        {
            MapBindIdentifier(bindIdentNode, handler);
        }
        else if (bindIdentNode->IsVarLetOrConst())
        {
            handler(bindIdentNode);
        }
        else
        {
            AssertMsg(bindIdentNode->nop == knopEmpty, "Invalid bind identifier");
        }
    }